

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::SmallVector<spv::Capability,_8UL>::SmallVector
          (SmallVector<spv::Capability,_8UL> *this)

{
  Capability *pCVar1;
  SmallVector<spv::Capability,_8UL> *this_local;
  
  VectorView<spv::Capability>::VectorView(&this->super_VectorView<spv::Capability>);
  this->buffer_capacity = 0;
  pCVar1 = AlignedBuffer<spv::Capability,_8UL>::data(&this->stack_storage);
  (this->super_VectorView<spv::Capability>).ptr = pCVar1;
  this->buffer_capacity = 8;
  return;
}

Assistant:

SmallVector() SPIRV_CROSS_NOEXCEPT
	{
		this->ptr = stack_storage.data();
		buffer_capacity = N;
	}